

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc.c
# Opt level: O1

int32_t ll_settings_store(void)

{
  _Bool _Var1;
  uint uVar2;
  
  _Var1 = transport_mutex_grab();
  if (_Var1) {
    uVar2 = hal_read_write(OP_STORE_SETTINGS,(uint8_t *)0x0,0,(uint8_t *)0x0,0);
    transport_mutex_release();
    return (int)uVar2 >> 0x1f & uVar2;
  }
  return -0x71;
}

Assistant:

int32_t ll_settings_store(void)
{
    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    int32_t ret = hal_read_write(OP_STORE_SETTINGS, NULL, 0, NULL, 0);

    transport_mutex_release();

    return (ret >= 0) ? LL_IFC_ACK : ret;
}